

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O0

void __thiscall re2c::free_list<const_re2c::Code_*>::clear(free_list<const_re2c::Code_*> *this)

{
  Code *this_00;
  bool bVar1;
  reference ppCVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  free_list<const_re2c::Code_*> *this_local;
  
  this->in_clear = true;
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>::
       begin(&this->
              super_set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
            );
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
         ::end(&this->
                super_set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
              );
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppCVar2 = std::_Rb_tree_const_iterator<const_re2c::Code_*>::operator*(&local_18);
    this_00 = *ppCVar2;
    if (this_00 != (Code *)0x0) {
      Code::~Code(this_00);
      operator_delete(this_00,0x48);
    }
    std::_Rb_tree_const_iterator<const_re2c::Code_*>::operator++(&local_18);
  }
  std::set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>::
  clear(&this->
         super_set<const_re2c::Code_*,_std::less<const_re2c::Code_*>,_std::allocator<const_re2c::Code_*>_>
       );
  this->in_clear = false;
  return;
}

Assistant:

void clear()
	{
		in_clear = true;

		for(iterator it = this->begin(); it != this->end(); ++it)
		{
			delete *it;
		}
		std::set<_Ty>::clear();
		
		in_clear = false;
	}